

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::AddScriptPubKeyMan
          (CWallet *this,uint256 *id,
          unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
          spkm_man)

{
  long lVar1;
  int iVar2;
  __uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> *this_00;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (__uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             *)std::
               map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
               ::operator[](&this->m_spk_managers,id);
  std::__uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
  operator=(this_00,(__uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                     *)spkm_man._M_t.
                       super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
                       .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl);
  iVar2 = (*((this_00->_M_t).
             super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
             .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl)->
            _vptr_ScriptPubKeyMan[0x13])();
  if (CONCAT44(extraout_var,iVar2) < (this->m_birth_time).super___atomic_base<long>._M_i) {
    LOCK();
    (this->m_birth_time).super___atomic_base<long>._M_i = CONCAT44(extraout_var,iVar2);
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddScriptPubKeyMan(const uint256& id, std::unique_ptr<ScriptPubKeyMan> spkm_man)
{
    // Add spkm_man to m_spk_managers before calling any method
    // that might access it.
    const auto& spkm = m_spk_managers[id] = std::move(spkm_man);

    // Update birth time if needed
    MaybeUpdateBirthTime(spkm->GetTimeFirstKey());
}